

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

PtexTexture * __thiscall
Ptex::v2_2::PtexReaderCache::get(PtexReaderCache *this,char *filename,String *error)

{
  size_t *psVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  PtexCachedReader *reader;
  PtexCachedReader *this_00;
  PtexCachedReader *this_01;
  char *pcVar5;
  char *pathToOpen;
  string buffer;
  StringKey key;
  char *local_70;
  string local_68;
  StringKey local_48;
  
  StringKey::StringKey(&local_48,filename);
  reader = PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::get
                     (&this->_files,&local_48);
  if (reader == (PtexCachedReader *)0x0) {
    this_00 = (PtexCachedReader *)operator_new(0x310);
    PtexCachedReader::PtexCachedReader(this_00,this->_premultiply,this->_io,this->_err,this);
LAB_0047590e:
    bVar3 = (this_00->super_PtexReader)._needToOpen;
    if (bVar3 == true) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_70 = filename;
      if ((this->_io != (PtexInputHandler *)0x0) ||
         (bVar4 = findFile(this,&local_70,&local_68,error), bVar4)) {
        PtexReader::open(&this_00->super_PtexReader,local_70,(int)error);
      }
      else {
        (this_00->super_PtexReader)._ok = false;
        (this_00->super_PtexReader)._needToOpen = false;
      }
      std::__cxx11::string::~string((string *)&local_68);
    }
    this_01 = this_00;
    if (reader == (PtexCachedReader *)0x0) {
      local_68._M_dataplus._M_p = (pointer)0x0;
      this_01 = PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::tryInsert
                          (&this->_files,&local_48,this_00,(size_t *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        LOCK();
        psVar1 = &this->_memUsed;
        sVar2 = *psVar1;
        *psVar1 = (size_t)(local_68._M_dataplus._M_p + *psVar1);
        UNLOCK();
        pcVar5 = local_68._M_dataplus._M_p + sVar2;
        if (local_68._M_dataplus._M_p + sVar2 < (char *)this->_peakMemUsed) {
          pcVar5 = (char *)this->_peakMemUsed;
        }
        this->_peakMemUsed = (size_t)pcVar5;
      }
      if (this_01 != this_00) {
        PtexCachedReader::ref(this_01);
        (*(this_00->super_PtexReader).super_PtexTexture._vptr_PtexTexture[1])(this_00);
      }
    }
    if ((this_01->super_PtexReader)._ok != false) {
      if (bVar3 != false) {
        LOCK();
        psVar1 = &(this_01->super_PtexReader)._opens;
        *psVar1 = *psVar1 + 1;
        UNLOCK();
      }
      goto LAB_004759fe;
    }
    LOCK();
    this_01->_refCount = this_01->_refCount + -1;
    UNLOCK();
  }
  else if ((reader->super_PtexReader)._ok != false) {
    if ((reader->super_PtexReader)._pendingPurge == true) {
      purge(this,reader);
    }
    PtexCachedReader::ref(reader);
    this_00 = reader;
    goto LAB_0047590e;
  }
  this_01 = (PtexCachedReader *)0x0;
LAB_004759fe:
  StringKey::~StringKey(&local_48);
  return (PtexTexture *)this_01;
}

Assistant:

PtexTexture* PtexReaderCache::get(const char* filename, Ptex::String& error)
{
    // lookup reader in map
    StringKey key(filename);
    PtexCachedReader* reader = _files.get(key);
    bool isNew = false;

    if (reader) {
        if (!reader->ok()) return 0;
        if (reader->pendingPurge()) {
            // a previous purge attempt was made and file was busy.  Try again now.
            purge(reader);
        }
        reader->ref();
    } else {
        reader = new PtexCachedReader(_premultiply, _io, _err, this);
        isNew = true;
    }

    bool needOpen = reader->needToOpen();
    if (needOpen) {
        std::string buffer;
        const char* pathToOpen = filename;
        // search for the file (unless we have an I/O handler)
        if (_io || findFile(pathToOpen, buffer, error)) {
            reader->open(pathToOpen, error);
        } else {
            // flag reader as invalid so we don't try to open it again on next lookup
            reader->invalidate();
        }
    }

    if (isNew) {
        size_t newMemUsed = 0;
        PtexCachedReader* newreader = reader;
        reader = _files.tryInsert(key, reader, newMemUsed);
        adjustMemUsed(newMemUsed);
        if (reader != newreader) {
            // another thread got here first
            reader->ref();
            delete newreader;
        }
    }

    if (!reader->ok()) {
        reader->unref();
        return 0;
    }

    if (needOpen) {
        reader->logOpen();
    }

    return reader;
}